

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver_test.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::FeatureResolverTest_MergeFeaturesUnknownEnumFeature_Test::TestBody
          (FeatureResolverTest_MergeFeaturesUnknownEnumFeature_Test *this)

{
  ushort *puVar1;
  bool bVar2;
  Descriptor *this_00;
  FieldDescriptor *field;
  Reflection *this_01;
  EnumDescriptor *this_02;
  EnumValueDescriptor *pEVar3;
  MatcherInterface<const_absl::lts_20250127::StatusOr<google::protobuf::FeatureSet>_&> *impl;
  ostream *poVar4;
  AssertionResult *other;
  StringLike<std::basic_string_view<char>_> *substring;
  StringLike<std::basic_string_view<char>_> *substring_00;
  VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *gmock_p0;
  HasErrorMatcherP<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *matcher_00;
  int index;
  char *pcVar5;
  AssertionResult gtest_ar_1;
  AssertionResult local_688;
  Matcher<const_absl::lts_20250127::StatusOr<google::protobuf::FeatureSet>_&> matcher;
  size_type local_660;
  pointer local_658;
  ulong local_650;
  long local_648;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_640;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_620;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  _Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5c0;
  StatusOrData<google::protobuf::FeatureSet> local_560;
  StatusOr<google::protobuf::FeatureResolver> resolver;
  stringstream ss;
  undefined4 uStack_4ac;
  ostream local_4a0 [376];
  FeatureSet local_328;
  _Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2d8;
  _Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_278;
  AssertionResult gtest_ar;
  FeatureSet features;
  
  SetupFeatureResolver<>(&resolver,EDITION_2023);
  _ss = 0;
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::StatusIsMatcherP<absl::lts_20250127::StatusCode>>
  ::operator()(&gtest_ar,(char *)&ss,&resolver);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&ss);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar5 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar5 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_5c0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/feature_resolver_test.cc"
               ,0x206,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_5c0,(Message *)&ss);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_5c0);
    if ((long *)CONCAT44(uStack_4ac,_ss) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_4ac,_ss) + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    this_00 = FeatureSet::GetDescriptor();
    for (index = 0; index < this_00->field_count_; index = index + 1) {
      field = Descriptor::field(this_00,index);
      FeatureSet::FeatureSet(&features);
      this_01 = FeatureSet::GetReflection();
      Reflection::SetEnumValue(this_01,&features.super_Message,field,0);
      puVar1 = (ushort *)(field->all_names_).payload_;
      local_650 = (ulong)*puVar1;
      local_648 = (long)puVar1 + ~local_650;
      testing::HasSubstr<std::basic_string_view<char,std::char_traits<char>>>
                (&local_600,(testing *)&local_650,substring);
      testing::HasSubstr<char[30]>
                (&local_620,(StringLike<char[30]> *)"must resolve to a known value");
      this_02 = FieldDescriptor::enum_type(field);
      pEVar3 = EnumDescriptor::FindValueByNumber(this_02,0);
      local_658 = (pEVar3->all_names_->_M_dataplus)._M_p;
      local_660 = pEVar3->all_names_->_M_string_length;
      testing::HasSubstr<std::basic_string_view<char,std::char_traits<char>>>
                (&local_640,(testing *)&local_660,substring_00);
      std::
      _Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Tuple_impl(&local_2d8,&local_600,&local_620,&local_640);
      protobuf::(anonymous_namespace)::
      HasError<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>>
                ((HasErrorMatcherP<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)&local_278,(_anonymous_namespace_ *)&local_2d8,gmock_p0);
      testing::internal::
      MakePredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::HasErrorMatcherP<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>>>
                ((PredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::HasErrorMatcherP<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  *)&local_5c0,(internal *)&local_278,matcher_00);
      absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureResolver>::
      EnsureOk(&resolver.super_StatusOrData<google::protobuf::FeatureResolver>);
      FeatureSet::FeatureSet(&local_328);
      FeatureResolver::MergeFeatures
                ((StatusOr<google::protobuf::FeatureSet> *)&local_560,
                 &resolver.super_StatusOrData<google::protobuf::FeatureResolver>.field_1.data_,
                 &local_328,&features);
      impl = (MatcherInterface<const_absl::lts_20250127::StatusOr<google::protobuf::FeatureSet>_&> *
             )operator_new(0x68);
      std::
      _Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Tuple_impl((_Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&gtest_ar,&local_5c0);
      (impl->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
           (_func_int **)&PTR__gmock_Impl_01610ad0;
      std::
      _Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Tuple_impl((_Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)(impl + 1),
                    (_Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&gtest_ar);
      testing::Matcher<const_absl::lts_20250127::StatusOr<google::protobuf::FeatureSet>_&>::Matcher
                ((Matcher<const_absl::lts_20250127::StatusOr<google::protobuf::FeatureSet>_&> *)
                 &matcher.
                  super_MatcherBase<const_absl::lts_20250127::StatusOr<google::protobuf::FeatureSet>_&>
                 ,impl);
      std::
      _Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Tuple_impl((_Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&gtest_ar);
      bVar2 = testing::internal::
              MatcherBase<const_absl::lts_20250127::StatusOr<google::protobuf::FeatureSet>_&>::
              Matches(&matcher.
                       super_MatcherBase<const_absl::lts_20250127::StatusOr<google::protobuf::FeatureSet>_&>
                      ,(StatusOr<google::protobuf::FeatureSet> *)&local_560);
      if (bVar2) {
        testing::AssertionSuccess();
      }
      else {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        poVar4 = std::operator<<(local_4a0,"Value of: ");
        poVar4 = std::operator<<(poVar4,"resolver->MergeFeatures(FeatureSet(), features)");
        poVar4 = std::operator<<(poVar4,"\n");
        std::operator<<(poVar4,"Expected: ");
        testing::internal::
        MatcherBase<const_absl::lts_20250127::StatusOr<google::protobuf::FeatureSet>_&>::DescribeTo
                  (&matcher.
                    super_MatcherBase<const_absl::lts_20250127::StatusOr<google::protobuf::FeatureSet>_&>
                   ,local_4a0);
        testing::StringMatchResultListener::StringMatchResultListener
                  ((StringMatchResultListener *)&gtest_ar);
        bVar2 = testing::internal::
                MatchPrintAndExplain<absl::lts_20250127::StatusOr<google::protobuf::FeatureSet>const,absl::lts_20250127::StatusOr<google::protobuf::FeatureSet>const&>
                          ((StatusOr<google::protobuf::FeatureSet> *)&local_560,&matcher,
                           (MatchResultListener *)&gtest_ar);
        if (bVar2) {
          std::operator<<(local_4a0,
                          "\n  The matcher failed on the initial attempt; but passed when rerun to generate the explanation."
                         );
        }
        poVar4 = std::operator<<(local_4a0,"\n  Actual: ");
        std::__cxx11::stringbuf::str();
        std::operator<<(poVar4,(string *)&local_5e0);
        std::__cxx11::string::~string((string *)&local_5e0);
        testing::AssertionFailure();
        std::__cxx11::stringbuf::str();
        other = testing::AssertionResult::operator<<(&local_688,&local_5e0);
        testing::AssertionResult::AssertionResult(&gtest_ar_1,other);
        std::__cxx11::string::~string((string *)&local_5e0);
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&local_688.message_);
        testing::StringMatchResultListener::~StringMatchResultListener
                  ((StringMatchResultListener *)&gtest_ar);
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      }
      testing::internal::
      MatcherBase<const_absl::lts_20250127::StatusOr<google::protobuf::FeatureSet>_&>::~MatcherBase
                (&matcher.
                  super_MatcherBase<const_absl::lts_20250127::StatusOr<google::protobuf::FeatureSet>_&>
                );
      absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSet>::
      ~StatusOrData(&local_560);
      FeatureSet::~FeatureSet(&local_328);
      std::
      _Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Tuple_impl(&local_5c0);
      std::
      _Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Tuple_impl(&local_278);
      std::
      _Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Tuple_impl(&local_2d8);
      std::__cxx11::string::~string((string *)&local_640);
      std::__cxx11::string::~string((string *)&local_620);
      std::__cxx11::string::~string((string *)&local_600);
      if (gtest_ar_1.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar);
        pcVar5 = anon_var_dwarf_651463 + 5;
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar5 = *(char **)gtest_ar_1.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&ss,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/feature_resolver_test.cc"
                   ,0x216,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&ss,(Message *)&gtest_ar);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ss);
        if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_1.message_);
      FeatureSet::~FeatureSet(&features);
    }
  }
  absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureResolver>::
  ~StatusOrData(&resolver.super_StatusOrData<google::protobuf::FeatureResolver>);
  return;
}

Assistant:

TEST(FeatureResolverTest, MergeFeaturesUnknownEnumFeature) {
  absl::StatusOr<FeatureResolver> resolver = SetupFeatureResolver(EDITION_2023);
  ASSERT_OK(resolver);

  // Use reflection to make sure we validate every enum feature in FeatureSet.
  const Descriptor& descriptor = *FeatureSet::descriptor();
  for (int i = 0; i < descriptor.field_count(); ++i) {
    const FieldDescriptor& field = *descriptor.field(i);

    FeatureSet features;
    const Reflection& reflection = *features.GetReflection();

    // Set the feature to a value of 0, which is unknown by convention.
    reflection.SetEnumValue(&features, &field, 0);
    EXPECT_THAT(
        resolver->MergeFeatures(FeatureSet(), features),
        HasError(AllOf(
            HasSubstr(field.name()), HasSubstr("must resolve to a known value"),
            HasSubstr(field.enum_type()->FindValueByNumber(0)->name()))));
  }
}